

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::XmlReporter::EndGroup(XmlReporter *this,string *param_2,Totals *totals)

{
  string *name;
  XmlWriter *in_RDI;
  unsigned_long *in_stack_fffffffffffffef0;
  allocator *this_00;
  string *in_stack_fffffffffffffef8;
  ScopedElement *in_stack_ffffffffffffff00;
  allocator *paVar1;
  string *in_stack_ffffffffffffff10;
  XmlWriter *this_01;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  this_01 = (XmlWriter *)&in_RDI->field_0x28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResults",&local_41);
  XmlWriter::scopedElement(in_RDI,in_stack_ffffffffffffff10);
  paVar1 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"successes",paVar1);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  paVar1 = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"failures",paVar1);
  name = (string *)
         XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                   ((ScopedElement *)paVar1,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  this_00 = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"expectedFailures",this_00);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            ((ScopedElement *)paVar1,name,(unsigned_long *)this_00);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  XmlWriter::endElement(this_01);
  return;
}

Assistant:

virtual void EndGroup( const std::string&, const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed )
                .writeAttribute( "expectedFailures", totals.assertions.failedButOk );
            m_xml.endElement();
        }